

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.c
# Opt level: O1

void addVariable(char *key,double val)

{
  int iVar1;
  variable *pvVar2;
  char *pcVar3;
  
  pvVar2 = variables_first;
  do {
    if (pvVar2 == (variable *)0x0) {
LAB_00105457:
      if (pvVar2 == (variable *)0x0) {
        pvVar2 = (variable *)malloc_(0x18);
        pcVar3 = strDup(key);
        pvVar2->key = pcVar3;
        pvVar2->value = val;
        pvVar2->next = variables_first;
        variables_first = pvVar2;
      }
      return;
    }
    iVar1 = strcmp(key,pvVar2->key);
    if (iVar1 == 0) {
      pvVar2->value = val;
      goto LAB_00105457;
    }
    pvVar2 = pvVar2->next;
  } while( true );
}

Assistant:

void addVariable(const char *key, double val)
{
    struct variable *var;

    if (replaceVariable(key, val)) {
        return;
    }

    var = malloc_(sizeof(struct variable));
    var->key = strDup(key);
    var->value = val;

    var->next = variables_first;
    variables_first = var;
}